

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O3

void __thiscall
testloop_handlers::Input_Event_Notify
          (testloop_handlers *this,Am_Drawonable *param_1,Am_Input_Event *ev)

{
  char cVar1;
  bool bVar2;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_14,"LEFT_DOWN",true);
  bVar2 = (local_14 & 0xffff) != 0x103;
  if (((!bVar2 || *(short *)ev != 0x103) && !(bool)(~(bVar2 || *(short *)ev == 0x103) & 1)) &&
     (cVar1 = Am_Input_Char::helper_check_equal(ev), cVar1 != '\0')) {
    test_reparent1();
    return;
  }
  Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_18,"MIDDLE_DOWN",true);
  bVar2 = (local_18 & 0xffff) != 0x103;
  if (((!bVar2 || *(short *)ev != 0x103) && !(bool)(~(bVar2 || *(short *)ev == 0x103) & 1)) &&
     (cVar1 = Am_Input_Char::helper_check_equal(ev), cVar1 != '\0')) {
    (**(code **)(*(long *)d2 + 0x50))(d2,0,0);
    return;
  }
  Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_1c,"RIGHT_DOWN",true);
  bVar2 = (local_1c & 0xffff) != 0x103;
  if (((!bVar2 || *(short *)ev != 0x103) && !(bool)(~(bVar2 || *(short *)ev == 0x103) & 1)) &&
     (cVar1 = Am_Input_Char::helper_check_equal(ev), cVar1 != '\0')) {
    bVar2 = Input_Event_Notify::visible == false;
    Input_Event_Notify::visible = (bool)(Input_Event_Notify::visible ^ 1);
    (**(code **)(*(long *)d2 + 0x70))(d2,bVar2);
  }
  return;
}

Assistant:

void Input_Event_Notify(Am_Drawonable *, Am_Input_Event *ev) override
  {
    if (ev->input_char == "LEFT_DOWN")
      test_reparent1();
    else if (ev->input_char == "MIDDLE_DOWN")
      d2->Set_Position(0, 0);
    else if (ev->input_char == "RIGHT_DOWN") {
      static bool visible = true;
      if (visible == true)
        visible = false;
      else
        visible = true;
      d2->Set_Visible(visible);
    }
  }